

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  int i;
  uint uVar9;
  uint8_t b;
  uint8_t a;
  int i_2;
  uint uVar10;
  bool bVar11;
  int local_244;
  char local_238 [256];
  char seenl [256];
  
  fwrite("Test: test_add\n",0xf,1,_stderr);
  uVar9 = 1;
  uVar1 = gf256_add('\x01','\x01');
  if (uVar1 == '\0') {
    uVar1 = gf256_add(0x85,0x85);
    if (uVar1 != '\0') goto LAB_001011e7;
    uVar1 = gf256_add('5','{');
    if (uVar1 != 'N') goto LAB_001011e7;
    fwrite("--> pass\n",9,1,_stderr);
    local_244 = 0;
  }
  else {
LAB_001011e7:
    fwrite("--> FAIL (test test_add)\n",0x19,1,_stderr);
    local_244 = 1;
  }
  fwrite("Test: test_logexp\n",0x12,1,_stderr);
  bVar8 = true;
  for (; uVar9 != 0x100; uVar9 = uVar9 + 1) {
    uVar5 = gf256_log((uint8_t)uVar9);
    if (0xff < uVar5) {
      bVar8 = false;
      fprintf(_stderr,"  gf256_log(%d): got %d\n",(ulong)uVar9,(ulong)uVar5);
    }
  }
  for (uVar9 = 0; uVar9 != 0xff; uVar9 = uVar9 + 1) {
    uVar1 = gf256_exp(uVar9);
    if (uVar1 == '\0') {
      bVar8 = false;
      fprintf(_stderr,"  gf256_exp(%d) == 0 !\n",(ulong)uVar9);
    }
  }
  for (uVar9 = 1; uVar9 != 0x100; uVar9 = uVar9 + 1) {
    iVar6 = gf256_log((uint8_t)uVar9);
    bVar2 = gf256_exp(iVar6);
    if (uVar9 != bVar2) {
      bVar8 = false;
      fprintf(_stderr,"  gf256_exp(gf256_log(%d)) == %d !\n",(ulong)uVar9);
    }
  }
  if (bVar8) {
    fwrite("--> pass\n",9,1,_stderr);
  }
  else {
    fwrite("--> FAIL (test test_logexp)\n",0x1c,1,_stderr);
    local_244 = 1;
  }
  fwrite("Test: test_mul\n",0xf,1,_stderr);
  uVar1 = gf256_mul('\0','\0');
  if (uVar1 == '\0') {
    uVar1 = gf256_mul('\x1a','\0');
    if (uVar1 == '\0') {
      uVar1 = gf256_mul('\0',0x8f);
      bVar8 = true;
      if (uVar1 == '\0') goto LAB_00101359;
    }
  }
  fwrite("  nonzero result from 0*x or x*0.\n",0x22,1,_stderr);
  bVar8 = false;
LAB_00101359:
  for (uVar9 = 0; uVar9 != 0x100; uVar9 = uVar9 + 1) {
    bVar2 = gf256_mul('\x01',(uint8_t)uVar9);
    bVar3 = gf256_mul((uint8_t)uVar9,'\x01');
    if (uVar9 != bVar2) {
      bVar8 = false;
      fprintf(_stderr,"  1 * %d == %d !\n",(ulong)uVar9,(ulong)(uint)bVar2);
    }
    if (uVar9 != bVar3) {
      bVar8 = false;
      fprintf(_stderr,"  1 * %d == %d !\n",(ulong)uVar9);
    }
  }
  for (uVar9 = 0; uVar9 != 0x100; uVar9 = uVar9 + 1) {
    iVar6 = 8;
    uVar5 = uVar9;
    while( true ) {
      bVar11 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar11) break;
      bVar2 = gf256_mul((uint8_t)uVar5,(uint8_t)uVar5);
      uVar5 = (uint)bVar2;
    }
    if (uVar9 != (uVar5 & 0xff)) {
      bVar8 = false;
      fprintf(_stderr,"  %d^256 == %d\n",(ulong)uVar9);
    }
  }
  memset(seenl,0,0x100);
  memset(local_238,0,0x100);
  for (iVar6 = 0; iVar6 != 0x100; iVar6 = iVar6 + 1) {
    bVar2 = gf256_mul('9',(uint8_t)iVar6);
    bVar3 = gf256_mul((uint8_t)iVar6,0xb9);
    if ((seenl[bVar2] != '\0') || (local_238[bVar3] != '\0')) {
      fwrite(" x |-> cst * x is not one-on-one\n",0x21,1,_stderr);
      bVar8 = false;
    }
    seenl[bVar2] = '\x01';
    local_238[bVar3] = '\x01';
  }
  iVar6 = 100;
  while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
    uVar9 = rand();
    uVar5 = rand();
    b = (uint8_t)uVar5;
    a = (uint8_t)uVar9;
    uVar1 = gf256_mul(a,b);
    uVar4 = gf256_mul(b,a);
    __stream = _stderr;
    if (uVar1 != uVar4) {
      bVar2 = gf256_mul(a,b);
      bVar3 = gf256_mul(b,a);
      bVar8 = false;
      fprintf(__stream,"  %d * %d = %d, but %d * %d = %d\n",(ulong)(uVar9 & 0xff),
              (ulong)(uVar5 & 0xff),(ulong)bVar2,(ulong)(uVar5 & 0xff),(ulong)(uVar9 & 0xff),
              (ulong)bVar3);
    }
  }
  iVar6 = 100;
  while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
    uVar9 = rand();
    uVar5 = rand();
    uVar7 = rand();
    uVar1 = gf256_mul((uint8_t)uVar9,(uint8_t)uVar5);
    bVar2 = gf256_mul(uVar1,(uint8_t)uVar7);
    uVar1 = gf256_mul((uint8_t)uVar5,(uint8_t)uVar7);
    bVar3 = gf256_mul((uint8_t)uVar9,uVar1);
    if (bVar2 != bVar3) {
      bVar8 = false;
      fprintf(_stderr,"  (%d * %d) * %d == %d, but %d * (%d * %d) == %d\n",(ulong)(uVar9 & 0xff),
              (ulong)(uVar5 & 0xff),(ulong)(uVar7 & 0xff),(ulong)bVar2,(ulong)(uVar9 & 0xff),
              (ulong)(uVar5 & 0xff),(ulong)(uVar7 & 0xff),(ulong)bVar3);
    }
  }
  iVar6 = 100;
  while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
    uVar9 = rand();
    uVar5 = rand();
    uVar7 = rand();
    uVar1 = gf256_add((uint8_t)uVar5,(uint8_t)uVar7);
    uVar10 = uVar9 & 0xff;
    uVar4 = (uint8_t)uVar9;
    bVar2 = gf256_mul(uVar4,uVar1);
    uVar1 = gf256_mul(uVar4,(uint8_t)uVar5);
    uVar4 = gf256_mul(uVar4,(uint8_t)uVar7);
    bVar3 = gf256_add(uVar1,uVar4);
    if (bVar2 != bVar3) {
      bVar8 = false;
      fprintf(_stderr,"  %d * (%d + %d) = %d, but %d * %d + %d * %d = %d\n",(ulong)uVar10,
              (ulong)(uVar5 & 0xff),(ulong)(uVar7 & 0xff),(ulong)bVar2,(ulong)uVar10,
              (ulong)(uVar5 & 0xff),(ulong)uVar10,(ulong)(uVar7 & 0xff),(ulong)bVar3);
    }
  }
  if (bVar8) {
    fwrite("--> pass\n",9,1,_stderr);
  }
  else {
    fwrite("--> FAIL (test test_mul)\n",0x19,1,_stderr);
    local_244 = 1;
  }
  fwrite("Test: test_inv\n",0xf,1,_stderr);
  bVar8 = true;
  for (uVar9 = 1; uVar9 != 0x100; uVar9 = uVar9 + 1) {
    uVar1 = gf256_inv((uint8_t)uVar9);
    bVar2 = gf256_mul((uint8_t)uVar9,uVar1);
    if (bVar2 != 1) {
      bVar8 = false;
      fprintf(_stderr,"  %d * ~%d == %d\n",(ulong)uVar9,(ulong)uVar9,(ulong)bVar2);
    }
  }
  for (uVar9 = 1; uVar9 != 0x100; uVar9 = uVar9 + 1) {
    uVar1 = gf256_inv((uint8_t)uVar9);
    bVar2 = gf256_inv(uVar1);
    if (uVar9 != bVar2) {
      bVar8 = false;
      fprintf(_stderr,"  ~~%d = %d.\n",(ulong)uVar9);
    }
  }
  if (bVar8) {
    fwrite("--> pass\n",9,1,_stderr);
  }
  else {
    fwrite("--> FAIL (test test_inv)\n",0x19,1,_stderr);
    local_244 = 1;
  }
  return local_244;
}

Assistant:

int main()
{
	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		fprintf(stderr, "Test: " #x "\n"); \
		if (!x()) { \
			fprintf(stderr, "--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			fprintf(stderr, "--> pass\n"); \
		} \
	} while(0)

	RUN_TEST(test_add);
	RUN_TEST(test_logexp);
	RUN_TEST(test_mul);
	RUN_TEST(test_inv);

#undef RUN_TEST
	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}